

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line.hpp
# Opt level: O1

bool pstore::command_line::details::check_for_missing<std::ostream>
               (string *program_name,basic_ostream<char,_std::char_traits<char>_> *errs)

{
  option *this;
  uint uVar1;
  int iVar2;
  _List_node_base *p_Var3;
  string *psVar4;
  ostream *poVar5;
  long lVar6;
  _List_node_base *p_Var7;
  bool bVar8;
  char *pcVar9;
  int iVar10;
  
  p_Var3 = (_List_node_base *)option::all_abi_cxx11_();
  p_Var7 = p_Var3->_M_next;
  if (p_Var7 == p_Var3) {
    bVar8 = true;
    iVar10 = 0;
  }
  else {
    iVar10 = 0;
    bVar8 = true;
    do {
      this = (option *)p_Var7[1]._M_next;
      uVar1 = (*this->_vptr_option[3])(this);
      if (((uVar1 & 0xfffffffe) == 2) && (iVar2 = (*this->_vptr_option[4])(this), iVar2 == 0)) {
        iVar2 = (*this->_vptr_option[9])(this);
        if ((char)iVar2 == '\0') {
          poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                             (errs,(program_name->_M_dataplus)._M_p,program_name->_M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,": option \'",10);
          psVar4 = option::name_abi_cxx11_(this);
          poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar5,(psVar4->_M_dataplus)._M_p,psVar4->_M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar5,"\' must be specified at least once\n",0x22);
        }
        else {
          iVar10 = iVar10 + 1;
        }
        bVar8 = false;
      }
      p_Var7 = (((_List_base<pstore::command_line::option_*,_std::allocator<pstore::command_line::option_*>_>
                  *)&p_Var7->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
    } while (p_Var7 != p_Var3);
  }
  if (iVar10 != 0) {
    if (iVar10 == 1) {
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (errs,(program_name->_M_dataplus)._M_p,program_name->_M_string_length);
      pcVar9 = ": a positional argument was missing\n";
      lVar6 = 0x24;
    }
    else {
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (errs,(program_name->_M_dataplus)._M_p,program_name->_M_string_length);
      poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
      pcVar9 = ": positional arguments are missing\n";
      lVar6 = 0x23;
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,pcVar9,lVar6);
  }
  return bVar8;
}

Assistant:

bool check_for_missing (std::string const & program_name, ErrorStream & errs) {
                using str = stream_trait<typename ErrorStream::char_type>;
                using pstore::command_line::num_occurrences_flag;
                using pstore::command_line::option;

                bool ok = true;
                auto positional_missing = 0U;

                for (option const * const opt : option::all ()) {
                    switch (opt->get_num_occurrences_flag ()) {
                    case num_occurrences_flag::required:
                    case num_occurrences_flag::one_or_more:
                        if (opt->get_num_occurrences () == 0U) {
                            if (opt->is_positional ()) {
                                ++positional_missing;
                            } else {
                                errs << str::out_string (program_name)
                                     << str::out_text (": option '")
                                     << str::out_string (opt->name ())
                                     << str::out_text ("' must be specified at least once\n");
                            }
                            ok = false;
                        }
                        break;
                    case num_occurrences_flag::optional:
                    case num_occurrences_flag::zero_or_more: break;
                    }
                }

                if (positional_missing == 1U) {
                    errs << str::out_string (program_name)
                         << str::out_text (": a positional argument was missing\n");
                } else if (positional_missing > 1U) {
                    errs << str::out_string (program_name) << positional_missing
                         << str::out_text (": positional arguments are missing\n");
                }

                return ok;
            }